

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advancing_front.cc
# Opt level: O0

Node * __thiscall p2t::AdvancingFront::LocateNode(AdvancingFront *this,double x)

{
  Node *local_28;
  Node *node;
  double x_local;
  AdvancingFront *this_local;
  
  local_28 = this->search_node_;
  if (local_28->value <= x) {
    do {
      local_28 = local_28->next;
      if (local_28 == (Node *)0x0) {
        return (Node *)0x0;
      }
    } while (local_28->value <= x);
    this->search_node_ = local_28->prev;
    this_local = (AdvancingFront *)local_28->prev;
  }
  else {
    do {
      local_28 = local_28->prev;
      if (local_28 == (Node *)0x0) {
        return (Node *)0x0;
      }
    } while (x < local_28->value);
    this->search_node_ = local_28;
    this_local = (AdvancingFront *)local_28;
  }
  return (Node *)this_local;
}

Assistant:

Node* AdvancingFront::LocateNode(double x)
{
  Node* node = search_node_;

  if (x < node->value) {
    while ((node = node->prev) != NULL) {
      if (x >= node->value) {
        search_node_ = node;
        return node;
      }
    }
  } else {
    while ((node = node->next) != NULL) {
      if (x < node->value) {
        search_node_ = node->prev;
        return node->prev;
      }
    }
  }
  return NULL;
}